

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.tweetnacl.c
# Opt level: O0

void pack25519(uint8_t *out,int64_t *n)

{
  ulong uVar1;
  long local_138;
  gf t;
  gf m;
  ulong uStack_28;
  int b;
  size_t j;
  size_t i;
  int64_t *n_local;
  uint8_t *out_local;
  
  set25519(&local_138,n);
  car25519(&local_138);
  car25519(&local_138);
  car25519(&local_138);
  for (uStack_28 = 0; uStack_28 < 2; uStack_28 = uStack_28 + 1) {
    t[0xf] = local_138 + -0xffed;
    for (j = 1; j < 0xf; j = j + 1) {
      t[j + 0xf] = (t[j - 1] + -0xffff) - (t[j + 0xe] >> 0x10 & 1U);
      t[j + 0xe] = t[j + 0xe] & 0xffff;
    }
    uVar1 = m[0xd] >> 0x10;
    m[0xd] = m[0xd] & 0xffff;
    sel25519(&local_138,t + 0xf,
             (long)(int)(1 - ((uint)((t[0xe] + -0x7fff) - (uVar1 & 1) >> 0x10) & 1)));
  }
  for (j = 0; j < 0x10; j = j + 1) {
    out[j * 2] = (uint8_t)t[j - 1];
    out[j * 2 + 1] = (uint8_t)((ulong)t[j - 1] >> 8);
  }
  return;
}

Assistant:

static void pack25519(uint8_t out[32], const gf n)
{
  size_t i, j;
  int b;
  gf m, t;
  set25519(t, n);
  car25519(t);
  car25519(t);
  car25519(t);
  
  for(j = 0; j < 2; j++)
  {
    m[0] = t[0] - 0xffed;
    for (i = 1; i < 15; i++)
    {
      m[i] = t[i] - 0xffff - ((m[i - 1] >> 16) & 1);
      m[i - 1] &= 0xffff;
    }
    m[15] = t[15] - 0x7fff - ((m[14] >> 16) & 1);
    b = (m[15] >> 16) & 1;
    m[14] &= 0xffff;
    sel25519(t, m, 1 - b);
  }

  for (i = 0; i < 16; i++)
  {
    out[2 * i] = t[i] & 0xff;
    out[2 * i + 1] = (uint8_t) (t[i] >> 8);
  }
}